

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O1

void ssl_write_supported_point_formats_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  size_t sVar1;
  
  if ((ssl->handshake->cli_exts & 1) == 0) {
    sVar1 = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x772,"server hello, supported_point_formats extension");
    buf[0] = '\0';
    buf[1] = '\v';
    buf[2] = '\0';
    buf[3] = '\x02';
    buf[4] = '\x01';
    buf[5] = '\0';
    sVar1 = 6;
  }
  *olen = sVar1;
  return;
}

Assistant:

static void ssl_write_supported_point_formats_ext(mbedtls_ssl_context *ssl,
                                                  unsigned char *buf,
                                                  size_t *olen)
{
    unsigned char *p = buf;
    ((void) ssl);

    if ((ssl->handshake->cli_exts &
         MBEDTLS_TLS_EXT_SUPPORTED_POINT_FORMATS_PRESENT) == 0) {
        *olen = 0;
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("server hello, supported_point_formats extension"));

    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_SUPPORTED_POINT_FORMATS, p, 0);
    p += 2;

    *p++ = 0x00;
    *p++ = 2;

    *p++ = 1;
    *p++ = MBEDTLS_ECP_PF_UNCOMPRESSED;

    *olen = 6;
}